

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_>::
TypedAttributeWithFallback
          (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *this,
          TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *param_1)

{
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *param_1_local;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *this_local;
  
  AttrMetas::AttrMetas(&this->_metas,&param_1->_metas);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
            (&this->_paths,&param_1->_paths);
  nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::Visibility>_>::optional
            (&this->_attrib,&param_1->_attrib);
  this->_empty = (bool)(param_1->_empty & 1);
  Animatable<tinyusdz::Visibility>::Animatable(&this->_fallback,&param_1->_fallback);
  this->_blocked = (bool)(param_1->_blocked & 1);
  return;
}

Assistant:

static uint32_t type_id() { return value::TypeTraits<T>::type_id(); }